

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O0

void oonf_viewer_output_prepare
               (oonf_viewer_template *template,abuf_template_storage *storage,autobuf *out,
               char *format)

{
  char *local_28;
  char *format_local;
  autobuf *out_local;
  abuf_template_storage *storage_local;
  oonf_viewer_template *template_local;
  
  template->out = out;
  if ((template->create_json & 1U) == 0) {
    local_28 = format;
    if ((format != (char *)0x0) && (*format == '\0')) {
      local_28 = (char *)0x0;
    }
    template->_storage = storage;
    abuf_template_init_ext(template->_storage,template->data,template->data_size,local_28);
  }
  else {
    template->_storage = (abuf_template_storage *)0x0;
    json_init_session(&template->_json,out);
    if ((template->create_only_data & 1U) == 0) {
      json_start_object(&template->_json,0);
    }
    json_start_array(&template->_json,template->json_name);
  }
  return;
}

Assistant:

void
oonf_viewer_output_prepare(struct oonf_viewer_template *template, struct abuf_template_storage *storage,
  struct autobuf *out, const char *format) {
  template->out = out;

  if (template->create_json) {
    /* JSON format */
    template->_storage = NULL;
    json_init_session(&template->_json, out);

    /* start wrapper object */
    if (!template->create_only_data) {
      json_start_object(&template->_json, NULL);
    }

    /* start object with array */
    json_start_array(&template->_json, template->json_name);
  }
  else {
    if (format && *format == 0) {
      format = NULL;
    }

    /* no JSON format, generate template entries */
    template->_storage = storage;
    abuf_template_init_ext(template->_storage, template->data, template->data_size, format);
  }
}